

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O1

void Bac_ManMarkNodesAbc(Bac_Man_t *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  uint uVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  if ((p->vBuf2LeafNtk).nSize != pNtk->nBarBufs2) {
    __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == pNtk->nBarBufs2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                  ,0x1be,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
  }
  pVVar7 = pNtk->vPis;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      *(undefined4 *)((long)pVVar7->pArray[lVar6] + 0x40) = 1;
      lVar6 = lVar6 + 1;
      pVVar7 = pNtk->vPis;
    } while (lVar6 < pVVar7->nSize);
  }
  pVVar7 = pNtk->vObjs;
  if (pVVar7->nSize < 1) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    do {
      plVar2 = (long *)pVVar7->pArray[lVar6];
      if ((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) {
        lVar3 = *plVar2;
        uVar8 = *(uint *)(lVar3 + 4) ^ 4;
        if ((uVar8 == 0) && ((*(int *)((long)plVar2 + 0x1c) == 1 && (plVar2[7] == 0)))) {
          if (((int)uVar5 < 0) || ((p->vBuf2LeafNtk).nSize <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar9 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          *(int *)(plVar2 + 8) = (p->vBuf2LeafNtk).pArray[uVar9];
        }
        else if ((0 < *(int *)((long)plVar2 + 0x1c)) &&
                ((uVar8 != 0 || *(int *)((long)plVar2 + 0x1c) != 1 || (plVar2[7] != 0)))) {
          iVar1 = *(int *)(*(long *)(*(long *)(*(long *)(lVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar2[4] * 8) + 0x40);
          *(int *)(plVar2 + 8) = iVar1;
          if (0 < (long)*(int *)((long)plVar2 + 0x1c)) {
            lVar10 = 0;
            do {
              if (iVar1 != *(int *)(*(long *)(*(long *)(*(long *)(lVar3 + 0x20) + 8) +
                                             (long)((int *)plVar2[4])[lVar10] * 8) + 0x40)) {
                __assert_fail("pObj->iTemp == pFanin->iTemp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                              ,0x1c9,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
              }
              lVar10 = lVar10 + 1;
            } while (*(int *)((long)plVar2 + 0x1c) != lVar10);
          }
        }
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pNtk->vObjs;
    } while (lVar6 < pVVar7->nSize);
  }
  pVVar7 = pNtk->vPos;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      plVar2 = (long *)pVVar7->pArray[lVar6];
      plVar4 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      if ((((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7) && (0 < *(int *)((long)plVar4 + 0x1c))) &&
         ((*(int *)((long)plVar4 + 0x1c) != 1 || ((*(int *)(*plVar4 + 4) != 4 || (plVar4[7] != 0))))
         )) {
        if ((int)plVar4[8] != 1) {
          __assert_fail("Abc_ObjFanin0(pObj)->iTemp == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                        ,0x1d0,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
        }
        *(undefined4 *)(plVar2 + 8) = 1;
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pNtk->vPos;
    } while (lVar6 < pVVar7->nSize);
  }
  if (uVar5 == pNtk->nBarBufs2) {
    return;
  }
  __assert_fail("Count == pNtk->nBarBufs2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                ,0x1d3,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
}

Assistant:

void Bac_ManMarkNodesAbc( Bac_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin; int i, k, Count = 0;
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == pNtk->nBarBufs2 );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->iTemp = 1;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjIsBarBuf(pObj) )
            pObj->iTemp = Vec_IntEntry( &p->vBuf2LeafNtk, Count++ );
        else if ( Abc_NodeIsSeriousGate(pObj) )
        {
            pObj->iTemp = Abc_ObjFanin0(pObj)->iTemp;
            Abc_ObjForEachFanin( pObj, pFanin, k )
                assert( pObj->iTemp == pFanin->iTemp );
        }
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsSeriousGate(Abc_ObjFanin0(pObj)) )
            continue;
        assert( Abc_ObjFanin0(pObj)->iTemp == 1 );
        pObj->iTemp = Abc_ObjFanin0(pObj)->iTemp;
    }
    assert( Count == pNtk->nBarBufs2 );
}